

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O2

void __thiscall QtMWidgets::Scroller::Scroller(Scroller *this,QObject *target,QObject *parent)

{
  ScrollerPrivate *this_00;
  Scroller *ctx;
  Object local_30 [8];
  Object local_28 [8];
  
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_001aec40;
  this_00 = (ScrollerPrivate *)operator_new(0x78);
  ctx = this;
  ScrollerPrivate::ScrollerPrivate(this_00,this,target);
  (this->d).d = this_00;
  ScrollerPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::Scroller::*)(QVariant_const&)>
            (local_28,(offset_in_QVariantAnimation_to_subr)((this->d).d)->scrollAnimation,
             (Object *)QVariantAnimation::valueChanged,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  QObject::connect<void(QAbstractAnimation::*)(),void(QtMWidgets::Scroller::*)()>
            (local_30,(offset_in_QAbstractAnimation_to_subr)((this->d).d)->scrollAnimation,
             (Object *)QAbstractAnimation::finished,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  return;
}

Assistant:

Scroller::Scroller( QObject * target, QObject * parent )
	:	QObject( parent )
	,	d( new ScrollerPrivate( this, target ) )
{
	d->init();

	connect( d->scrollAnimation, &QVariantAnimation::valueChanged,
		this, &Scroller::_q_animation );

	connect( d->scrollAnimation, &QVariantAnimation::finished,
		this, &Scroller::_q_animationFinished );
}